

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cpp
# Opt level: O1

String * Directory::getHomeDirectory(void)

{
  long lVar1;
  __uid_t __uid;
  passwd *ppVar2;
  usize length;
  char *start;
  String *in_RDI;
  
  __uid = geteuid();
  ppVar2 = getpwuid(__uid);
  if (ppVar2 == (passwd *)0x0) {
    in_RDI->data = &String::emptyData.super_Data;
  }
  else {
    length = 0xffffffffffffffff;
    do {
      lVar1 = length + 1;
      length = length + 1;
    } while (ppVar2->pw_dir[lVar1] != '\0');
    String::String(in_RDI,ppVar2->pw_dir,length);
  }
  return in_RDI;
}

Assistant:

String Directory::getHomeDirectory()
{
#ifdef _WIN32
    char path[MAX_PATH + 2];
    if (!SHGetSpecialFolderPath(NULL, path, CSIDL_PROFILE, FALSE))
        return String();
    return String::fromCString(path);
#else
    const struct passwd* pw = getpwuid(geteuid());
    if (!pw)
        return String();
    return String::fromCString(pw->pw_dir);
#endif
}